

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

void xmlFAParseCharClassEsc(xmlRegParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlChar *pxVar2;
  uint uVar3;
  uint uVar4;
  xmlRegAtomPtr pxVar5;
  xmlRegAtomType xVar6;
  int neg;
  char *extra;
  
  pxVar2 = ctxt->cur;
  if (*pxVar2 != '\\') {
    if (*pxVar2 != '.') {
      ctxt->error = 0x5aa;
      extra = "Escaped sequence: expecting \\";
      goto LAB_0019f6ff;
    }
    pxVar5 = ctxt->atom;
    if (pxVar5 == (xmlRegAtomPtr)0x0) {
      pxVar5 = xmlRegNewAtom(ctxt,XML_REGEXP_ANYCHAR);
      ctxt->atom = pxVar5;
      goto LAB_0019f77a;
    }
    if (pxVar5->type != XML_REGEXP_RANGES) goto LAB_0019f77a;
    neg = ctxt->neg;
    xVar6 = XML_REGEXP_ANYCHAR;
    uVar4 = 0;
LAB_0019f775:
    xmlRegAtomAddRange(ctxt,pxVar5,neg,xVar6,uVar4,uVar4,(xmlChar *)0x0);
LAB_0019f77a:
    ctxt->cur = ctxt->cur + 1;
    return;
  }
  ctxt->cur = pxVar2 + 1;
  bVar1 = pxVar2[1];
  uVar4 = (uint)bVar1;
  uVar3 = (uint)bVar1;
  switch(bVar1) {
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x3a:
  case 0x3b:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x60:
  case 0x6e:
  case 0x72:
  case 0x74:
  case 0x75:
  case 0x7b:
  case 0x7c:
  case 0x7d:
  case 0x7e:
    pxVar5 = ctxt->atom;
    if (pxVar5 == (xmlRegAtomPtr)0x0) {
      pxVar5 = xmlRegNewAtom(ctxt,XML_REGEXP_CHARVAL);
      ctxt->atom = pxVar5;
      if (pxVar5 != (xmlRegAtomPtr)0x0) {
        switch(bVar1) {
        case 0x6e:
          pxVar5->codepoint = 10;
          break;
        case 0x72:
          pxVar5->codepoint = 0xd;
          break;
        case 0x74:
          pxVar5->codepoint = 9;
          break;
        case 0x75:
          uVar3 = parse_escaped_codeunit(ctxt);
          if ((uVar3 & 0xfffffc00) == 0xd800) {
            pxVar2 = ctxt->cur;
            ctxt->cur = pxVar2 + 1;
            if (((pxVar2[1] != '\\') || (ctxt->cur = pxVar2 + 2, pxVar2[2] != 'u')) ||
               (uVar4 = parse_escaped_codeunit(ctxt), (uVar4 & 0xfffffc00) != 0xdc00)) {
              ctxt->error = 0x5aa;
              extra = "Invalid low surrogate pair code unit";
              goto LAB_0019f6ff;
            }
            uVar3 = uVar3 * 0x400 + uVar4 + 0xfca02400;
          }
          if ((int)uVar3 < 0) {
            return;
          }
          pxVar5 = ctxt->atom;
        default:
          pxVar5->codepoint = uVar3;
        }
      }
      goto LAB_0019f77a;
    }
    if (pxVar5->type != XML_REGEXP_RANGES) goto LAB_0019f77a;
    if (bVar1 == 0x74) {
      uVar4 = 9;
    }
    else if (bVar1 == 0x72) {
      uVar4 = 0xd;
    }
    else if (bVar1 == 0x6e) {
      uVar4 = 10;
    }
    neg = ctxt->neg;
    xVar6 = XML_REGEXP_CHARVAL;
    goto LAB_0019f775;
  default:
    ctxt->error = 0x5aa;
    extra = "Wrong escape sequence, misuse of character \'\\\'";
    goto LAB_0019f6ff;
  case 0x43:
    xVar6 = XML_REGEXP_NOTNAMECHAR;
    break;
  case 0x44:
    xVar6 = XML_REGEXP_NOTDECIMAL;
    break;
  case 0x49:
    xVar6 = XML_REGEXP_NOTINITNAME;
    break;
  case 0x50:
    ctxt->cur = pxVar2 + 2;
    if (pxVar2[2] != '{') {
LAB_0019f8f2:
      ctxt->error = 0x5aa;
      extra = "Expecting \'{\'";
      goto LAB_0019f6ff;
    }
    ctxt->cur = pxVar2 + 3;
    xmlFAParseCharProp(ctxt);
    if (ctxt->atom != (xmlRegAtomPtr)0x0) {
      ctxt->atom->neg = 1;
    }
    goto LAB_0019f8dd;
  case 0x53:
    xVar6 = XML_REGEXP_NOTSPACE;
    break;
  case 0x57:
    xVar6 = XML_REGEXP_NOTREALCHAR;
    break;
  case 99:
    xVar6 = XML_REGEXP_NAMECHAR;
    break;
  case 100:
    xVar6 = XML_REGEXP_DECIMAL;
    break;
  case 0x69:
    xVar6 = XML_REGEXP_INITNAME;
    break;
  case 0x70:
    ctxt->cur = pxVar2 + 2;
    if (pxVar2[2] != '{') goto LAB_0019f8f2;
    ctxt->cur = pxVar2 + 3;
    xmlFAParseCharProp(ctxt);
LAB_0019f8dd:
    if (*ctxt->cur == '}') {
      ctxt->cur = ctxt->cur + 1;
      return;
    }
    ctxt->error = 0x5aa;
    extra = "Expecting \'}\'";
LAB_0019f6ff:
    xmlRegexpErrCompile(ctxt,extra);
    return;
  case 0x73:
    xVar6 = XML_REGEXP_ANYSPACE;
    break;
  case 0x77:
    xVar6 = XML_REGEXP_REALCHAR;
  }
  ctxt->cur = pxVar2 + 2;
  pxVar5 = ctxt->atom;
  if (pxVar5 == (xmlRegAtomPtr)0x0) {
    pxVar5 = xmlRegNewAtom(ctxt,xVar6);
    ctxt->atom = pxVar5;
  }
  else if (pxVar5->type == XML_REGEXP_RANGES) {
    xmlRegAtomAddRange(ctxt,pxVar5,ctxt->neg,xVar6,0,0,(xmlChar *)0x0);
  }
  return;
}

Assistant:

static void
xmlFAParseCharClassEsc(xmlRegParserCtxtPtr ctxt) {
    int cur;

    if (CUR == '.') {
	if (ctxt->atom == NULL) {
	    ctxt->atom = xmlRegNewAtom(ctxt, XML_REGEXP_ANYCHAR);
	} else if (ctxt->atom->type == XML_REGEXP_RANGES) {
	    xmlRegAtomAddRange(ctxt, ctxt->atom, ctxt->neg,
			       XML_REGEXP_ANYCHAR, 0, 0, NULL);
	}
	NEXT;
	return;
    }
    if (CUR != '\\') {
	ERROR("Escaped sequence: expecting \\");
	return;
    }
    NEXT;
    cur = CUR;
    if (cur == 'p') {
	NEXT;
	if (CUR != '{') {
	    ERROR("Expecting '{'");
	    return;
	}
	NEXT;
	xmlFAParseCharProp(ctxt);
	if (CUR != '}') {
	    ERROR("Expecting '}'");
	    return;
	}
	NEXT;
    } else if (cur == 'P') {
	NEXT;
	if (CUR != '{') {
	    ERROR("Expecting '{'");
	    return;
	}
	NEXT;
	xmlFAParseCharProp(ctxt);
        if (ctxt->atom != NULL)
	    ctxt->atom->neg = 1;
	if (CUR != '}') {
	    ERROR("Expecting '}'");
	    return;
	}
	NEXT;
    } else if ((cur == 'n') || (cur == 'r') || (cur == 't') || (cur == '\\') ||
	(cur == '|') || (cur == '.') || (cur == '?') || (cur == '*') ||
	(cur == '+') || (cur == '(') || (cur == ')') || (cur == '{') ||
	(cur == '}') || (cur == 0x2D) || (cur == 0x5B) || (cur == 0x5D) ||
	(cur == 0x5E) ||

	/* Non-standard escape sequences:
	 *                  Java 1.8|.NET Core 3.1|MSXML 6 */
	(cur == '!') ||     /*   +  |     +       |    +   */
	(cur == '"') ||     /*   +  |     +       |    +   */
	(cur == '#') ||     /*   +  |     +       |    +   */
	(cur == '$') ||     /*   +  |     +       |    +   */
	(cur == '%') ||     /*   +  |     +       |    +   */
	(cur == ',') ||     /*   +  |     +       |    +   */
	(cur == '/') ||     /*   +  |     +       |    +   */
	(cur == ':') ||     /*   +  |     +       |    +   */
	(cur == ';') ||     /*   +  |     +       |    +   */
	(cur == '=') ||     /*   +  |     +       |    +   */
	(cur == '>') ||     /*      |     +       |    +   */
	(cur == '@') ||     /*   +  |     +       |    +   */
	(cur == '`') ||     /*   +  |     +       |    +   */
	(cur == '~') ||     /*   +  |     +       |    +   */
	(cur == 'u')) {     /*      |     +       |    +   */
	if (ctxt->atom == NULL) {
	    ctxt->atom = xmlRegNewAtom(ctxt, XML_REGEXP_CHARVAL);
	    if (ctxt->atom != NULL) {
	        switch (cur) {
		    case 'n':
		        ctxt->atom->codepoint = '\n';
			break;
		    case 'r':
		        ctxt->atom->codepoint = '\r';
			break;
		    case 't':
		        ctxt->atom->codepoint = '\t';
			break;
		    case 'u':
			cur = parse_escaped_codepoint(ctxt);
			if (cur < 0) {
			    return;
			}
			ctxt->atom->codepoint = cur;
			break;
		    default:
			ctxt->atom->codepoint = cur;
		}
	    }
	} else if (ctxt->atom->type == XML_REGEXP_RANGES) {
            switch (cur) {
                case 'n':
                    cur = '\n';
                    break;
                case 'r':
                    cur = '\r';
                    break;
                case 't':
                    cur = '\t';
                    break;
            }
	    xmlRegAtomAddRange(ctxt, ctxt->atom, ctxt->neg,
			       XML_REGEXP_CHARVAL, cur, cur, NULL);
	}
	NEXT;
    } else if ((cur == 's') || (cur == 'S') || (cur == 'i') || (cur == 'I') ||
	(cur == 'c') || (cur == 'C') || (cur == 'd') || (cur == 'D') ||
	(cur == 'w') || (cur == 'W')) {
	xmlRegAtomType type = XML_REGEXP_ANYSPACE;

	switch (cur) {
	    case 's':
		type = XML_REGEXP_ANYSPACE;
		break;
	    case 'S':
		type = XML_REGEXP_NOTSPACE;
		break;
	    case 'i':
		type = XML_REGEXP_INITNAME;
		break;
	    case 'I':
		type = XML_REGEXP_NOTINITNAME;
		break;
	    case 'c':
		type = XML_REGEXP_NAMECHAR;
		break;
	    case 'C':
		type = XML_REGEXP_NOTNAMECHAR;
		break;
	    case 'd':
		type = XML_REGEXP_DECIMAL;
		break;
	    case 'D':
		type = XML_REGEXP_NOTDECIMAL;
		break;
	    case 'w':
		type = XML_REGEXP_REALCHAR;
		break;
	    case 'W':
		type = XML_REGEXP_NOTREALCHAR;
		break;
	}
	NEXT;
	if (ctxt->atom == NULL) {
	    ctxt->atom = xmlRegNewAtom(ctxt, type);
	} else if (ctxt->atom->type == XML_REGEXP_RANGES) {
	    xmlRegAtomAddRange(ctxt, ctxt->atom, ctxt->neg,
			       type, 0, 0, NULL);
	}
    } else {
	ERROR("Wrong escape sequence, misuse of character '\\'");
    }
}